

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

bool __thiscall rcg::Buffer::getContainsChunkdata(Buffer *this)

{
  bool bVar1;
  void *stream;
  
  if (this->payload_type == 4) {
    return true;
  }
  stream = Stream::getHandle(this->parent);
  bVar1 = anon_unknown_6::getBufferBool(&this->gentl,stream,this->buffer,0x1e);
  return bVar1;
}

Assistant:

bool Buffer::getContainsChunkdata() const
{
  if (payload_type == PAYLOAD_TYPE_CHUNK_DATA)
  {
    return true;
  }

  return getBufferBool(gentl, parent->getHandle(), buffer,
                       GenTL::BUFFER_INFO_CONTAINS_CHUNKDATA);
}